

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

void __thiscall
glcts::TestCaseBase::shaderSourceSpecialized
          (TestCaseBase *this,GLuint shader_id,GLsizei shader_count,GLchar **shader_string)

{
  int iVar1;
  undefined4 extraout_var;
  string specialized;
  char *specialized_cstr;
  string local_58;
  pointer local_38;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  specializeShader_abi_cxx11_(&local_58,this,shader_count,shader_string);
  local_38 = local_58._M_dataplus._M_p;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(shader_id,1,&local_38,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestCaseBase::shaderSourceSpecialized(glw::GLuint shader_id, glw::GLsizei shader_count,
										   const glw::GLchar* const* shader_string)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::string specialized		 = specializeShader(shader_count, shader_string);
	const char* specialized_cstr = specialized.c_str();
	gl.shaderSource(shader_id, 1, &specialized_cstr, NULL);
}